

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_sse2.c
# Opt level: O0

void av1_calc_indices_dim2_sse2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  char cVar1;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  short sVar13;
  undefined4 uVar14;
  undefined6 uVar15;
  short sVar16;
  undefined4 uVar17;
  undefined6 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined8 uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int64_t iVar33;
  int64_t *in_RCX;
  undefined8 *in_RDX;
  longlong in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  uint uVar34;
  uint uVar36;
  uint uVar37;
  undefined1 auVar35 [16];
  uint uVar38;
  __m128i a;
  __m128i d3;
  __m128i d2;
  __m128i dist2_1;
  __m128i dist1_1;
  __m128i ind1;
  __m128i dist2;
  __m128i dist1;
  __m128i cmp;
  __m128i dist;
  int j_1;
  __m128i dist_min;
  __m128i d1;
  __m128i in;
  int l;
  int i;
  int16_t cy;
  int16_t cx;
  int j;
  __m128i cents [8];
  __m128i ind [2];
  __m128i sum;
  __m128i v_zero;
  ulong local_428;
  ulong uStack_420;
  int local_40c;
  undefined1 local_408 [16];
  int local_3d8;
  int local_3d4;
  int local_3cc;
  undefined8 local_3c8 [16];
  ulong local_348 [4];
  long local_328;
  long lStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  int local_300;
  int local_2fc;
  int64_t *local_2f8;
  undefined8 *local_2f0;
  long local_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  ulong local_258;
  ulong uStack_250;
  uint local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  undefined1 local_1c8 [16];
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  ulong uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_128;
  ulong uStack_120;
  long local_118;
  long lStack_110;
  long local_108;
  long lStack_100;
  long local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined2 local_68;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_2c;
  ulong local_28;
  ulong uStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_318 = 0;
  uStack_310 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_328 = 0;
  lStack_320 = 0;
  local_300 = in_R9D;
  local_2fc = in_R8D;
  local_2f8 = in_RCX;
  local_2f0 = in_RDX;
  local_2e8 = in_RSI;
  local_2e0 = in_RDI;
  for (local_3cc = 0; local_3cc < local_300; local_3cc = local_3cc + 1) {
    local_5c = *(undefined2 *)(local_2e8 + (long)(local_3cc * 2) * 2);
    local_5a = *(undefined2 *)(local_2e8 + 2 + (long)(local_3cc * 2) * 2);
    local_5e = local_5a;
    local_60 = local_5c;
    local_62 = local_5a;
    local_64 = local_5c;
    local_66 = local_5a;
    local_68 = local_5c;
    local_78 = CONCAT26(local_5a,CONCAT24(local_5c,CONCAT22(local_5a,local_5c)));
    uVar9 = CONCAT26(local_5a,CONCAT24(local_5c,CONCAT22(local_5a,local_5c)));
    uStack_70 = uVar9;
    local_3c8[(long)local_3cc * 2] = local_78;
    local_3c8[(long)local_3cc * 2 + 1] = uVar9;
  }
  for (local_3d4 = 0; local_3d4 < local_2fc; local_3d4 = local_3d4 + 8) {
    for (local_3d8 = 0; local_3d8 < 2; local_3d8 = local_3d8 + 1) {
      local_2a0 = local_2e0;
      uVar9 = *local_2e0;
      uVar10 = local_2e0[1];
      local_2d8 = 0;
      uStack_2d0 = 0;
      local_348[(long)local_3d8 * 2] = 0;
      local_348[(long)local_3d8 * 2 + 1] = 0;
      local_268 = uVar9;
      uVar9 = local_268;
      uStack_260 = uVar10;
      uVar10 = uStack_260;
      local_278 = local_3c8[0];
      uVar22 = local_278;
      uStack_270 = local_3c8[1];
      uVar23 = uStack_270;
      local_268._0_2_ = (short)uVar9;
      local_268._2_2_ = (short)((ulong)uVar9 >> 0x10);
      local_268._4_2_ = (short)((ulong)uVar9 >> 0x20);
      local_268._6_2_ = (short)((ulong)uVar9 >> 0x30);
      uStack_260._0_2_ = (short)uVar10;
      uStack_260._2_2_ = (short)((ulong)uVar10 >> 0x10);
      uStack_260._4_2_ = (short)((ulong)uVar10 >> 0x20);
      uStack_260._6_2_ = (short)((ulong)uVar10 >> 0x30);
      local_278._0_2_ = (short)local_3c8[0];
      local_278._2_2_ = (short)((ulong)local_3c8[0] >> 0x10);
      local_278._4_2_ = (short)((ulong)local_3c8[0] >> 0x20);
      local_278._6_2_ = (short)((ulong)local_3c8[0] >> 0x30);
      uStack_270._0_2_ = (short)local_3c8[1];
      uStack_270._2_2_ = (short)((ulong)local_3c8[1] >> 0x10);
      uStack_270._4_2_ = (short)((ulong)local_3c8[1] >> 0x20);
      uStack_270._6_2_ = (short)((ulong)local_3c8[1] >> 0x30);
      local_168 = CONCAT26(local_268._6_2_ - local_278._6_2_,
                           CONCAT24(local_268._4_2_ - local_278._4_2_,
                                    CONCAT22(local_268._2_2_ - local_278._2_2_,
                                             (short)local_268 - (short)local_278)));
      uStack_160 = CONCAT26(uStack_260._6_2_ - uStack_270._6_2_,
                            CONCAT24(uStack_260._4_2_ - uStack_270._4_2_,
                                     CONCAT22(uStack_260._2_2_ - uStack_270._2_2_,
                                              (short)uStack_260 - (short)uStack_270)));
      local_178 = CONCAT26(local_268._6_2_ - local_278._6_2_,
                           CONCAT24(local_268._4_2_ - local_278._4_2_,
                                    CONCAT22(local_268._2_2_ - local_278._2_2_,
                                             (short)local_268 - (short)local_278)));
      uStack_170 = CONCAT26(uStack_260._6_2_ - uStack_270._6_2_,
                            CONCAT24(uStack_260._4_2_ - uStack_270._4_2_,
                                     CONCAT22(uStack_260._2_2_ - uStack_270._2_2_,
                                              (short)uStack_260 - (short)uStack_270)));
      auVar21._8_8_ = uStack_160;
      auVar21._0_8_ = local_168;
      auVar35._8_8_ = uStack_170;
      auVar35._0_8_ = local_178;
      local_408 = pmaddwd(auVar21,auVar35);
      for (local_40c = 1; uVar25 = uStack_40, uVar24 = local_48, local_48._0_4_ = local_408._0_4_,
          iVar29 = (int)local_48, local_48._4_4_ = local_408._4_4_, iVar30 = local_48._4_4_,
          uStack_40._0_4_ = local_408._8_4_, iVar31 = (int)uStack_40,
          uStack_40._4_4_ = local_408._12_4_, iVar32 = uStack_40._4_4_, local_40c < local_300;
          local_40c = local_40c + 1) {
        uVar11 = local_3c8[(long)local_40c * 2];
        uVar12 = local_3c8[(long)local_40c * 2 + 1];
        local_288 = uVar9;
        uStack_280 = uVar10;
        local_298 = uVar11;
        uVar11 = local_298;
        uStack_290 = uVar12;
        uVar12 = uStack_290;
        local_298._0_2_ = (short)uVar11;
        local_298._2_2_ = (short)((ulong)uVar11 >> 0x10);
        local_298._4_2_ = (short)((ulong)uVar11 >> 0x20);
        local_298._6_2_ = (short)((ulong)uVar11 >> 0x30);
        uStack_290._0_2_ = (short)uVar12;
        uStack_290._2_2_ = (short)((ulong)uVar12 >> 0x10);
        uStack_290._4_2_ = (short)((ulong)uVar12 >> 0x20);
        uStack_290._6_2_ = (short)((ulong)uVar12 >> 0x30);
        local_188 = CONCAT26(local_268._6_2_ - local_298._6_2_,
                             CONCAT24(local_268._4_2_ - local_298._4_2_,
                                      CONCAT22(local_268._2_2_ - local_298._2_2_,
                                               (short)local_268 - (short)local_298)));
        uStack_180 = CONCAT26(uStack_260._6_2_ - uStack_290._6_2_,
                              CONCAT24(uStack_260._4_2_ - uStack_290._4_2_,
                                       CONCAT22(uStack_260._2_2_ - uStack_290._2_2_,
                                                (short)uStack_260 - (short)uStack_290)));
        local_198 = local_188;
        uStack_190 = uStack_180;
        auVar20._8_8_ = uStack_180;
        auVar20._0_8_ = local_188;
        auVar19._8_8_ = uStack_180;
        auVar19._0_8_ = local_188;
        auVar35 = pmaddwd(auVar20,auVar19);
        local_428 = auVar35._0_8_;
        uStack_420 = auVar35._8_8_;
        local_48 = local_408._0_8_;
        uStack_40 = local_408._8_8_;
        local_58 = local_428;
        uVar27 = local_58;
        uStack_50 = uStack_420;
        uVar28 = uStack_50;
        local_58._0_4_ = auVar35._0_4_;
        local_58._4_4_ = auVar35._4_4_;
        uStack_50._0_4_ = auVar35._8_4_;
        uStack_50._4_4_ = auVar35._12_4_;
        uVar34 = -(uint)((int)local_58 < iVar29);
        uVar36 = -(uint)(local_58._4_4_ < iVar30);
        uVar37 = -(uint)((int)uStack_50 < iVar31);
        uVar38 = -(uint)(uStack_50._4_4_ < iVar32);
        local_1e8 = CONCAT44(uVar36,uVar34);
        uStack_1e0 = CONCAT44(uVar38,uVar37);
        local_1f8 = local_408._0_8_;
        uStack_1f0 = local_408._8_8_;
        local_228 = ~CONCAT44(uVar36,uVar34) & local_408._0_8_;
        uStack_220 = ~CONCAT44(uVar38,uVar37) & local_408._8_8_;
        local_1a8 = CONCAT44(uVar36,uVar34);
        uStack_1a0 = CONCAT44(uVar38,uVar37);
        local_1b8 = local_428;
        uStack_1b0 = uStack_420;
        local_238 = CONCAT44(uVar36,uVar34) & local_428;
        uStack_230 = CONCAT44(uVar38,uVar37) & uStack_420;
        local_408._8_8_ = uStack_220 | uStack_230;
        local_408._0_8_ = local_228 | local_238;
        local_2c = local_40c;
        local_4 = local_40c;
        local_8 = local_40c;
        local_c = local_40c;
        local_10 = local_40c;
        local_28 = CONCAT44(local_40c,local_40c);
        uStack_20 = CONCAT44(local_40c,local_40c);
        local_218 = local_348[(long)local_3d8 * 2];
        uStack_210 = local_348[(long)local_3d8 * 2 + 1];
        local_208 = CONCAT44(uVar36,uVar34);
        uStack_200 = CONCAT44(uVar38,uVar37);
        uVar24 = local_218;
        uVar25 = uStack_210;
        local_218._4_4_ = (uint)(local_218 >> 0x20);
        uStack_210._4_4_ = (uint)(uStack_210 >> 0x20);
        local_248 = (uVar34 ^ 0xffffffff) & (uint)local_218;
        uStack_244 = (uVar36 ^ 0xffffffff) & local_218._4_4_;
        uStack_240 = (uVar37 ^ 0xffffffff) & (uint)uStack_210;
        uStack_23c = (uVar38 ^ 0xffffffff) & uStack_210._4_4_;
        local_1c8._8_4_ = uVar37;
        local_1c8._0_8_ = CONCAT44(uVar36,uVar34);
        local_1c8._12_4_ = uVar38;
        auVar35 = local_1c8;
        local_1d8 = local_28;
        uStack_1d0 = uStack_20;
        local_258 = CONCAT44(uVar36,uVar34) & local_28;
        uStack_250 = local_1c8._8_8_ & uStack_20;
        local_348[(long)local_3d8 * 2] = CONCAT44(uStack_244,local_248) | local_258;
        local_348[(long)local_3d8 * 2 + 1] =
             CONCAT44(uStack_23c,uStack_240) | local_1c8._8_8_ & uStack_20;
        local_298 = uVar11;
        uStack_290 = uVar12;
        local_218 = uVar24;
        uStack_210 = uVar25;
        local_1c8 = auVar35;
        local_58 = uVar27;
        uStack_50 = uVar28;
      }
      if (local_2f8 != (int64_t *)0x0) {
        local_148 = local_408._0_8_;
        uStack_140 = local_408._8_8_;
        local_158 = local_318;
        uVar11 = local_158;
        uStack_150 = uStack_310;
        local_158._0_4_ = (undefined4)local_318;
        local_158._4_4_ = (undefined4)((ulong)local_318 >> 0x20);
        local_128 = local_408._0_8_;
        uStack_120 = local_408._8_8_;
        local_138 = local_318;
        uStack_130 = uStack_310;
        uVar12 = uStack_130;
        uStack_130._0_4_ = (undefined4)uStack_310;
        uStack_130._4_4_ = (undefined4)((ulong)uStack_310 >> 0x20);
        local_e8 = local_328;
        lStack_e0 = lStack_320;
        local_f8 = CONCAT44((undefined4)local_158,(int)local_48);
        lStack_f0 = CONCAT44(local_158._4_4_,local_48._4_4_);
        local_108 = local_328 + CONCAT44((undefined4)local_158,(int)local_48);
        lStack_100 = lStack_320 + CONCAT44(local_158._4_4_,local_48._4_4_);
        local_118 = CONCAT44((undefined4)uStack_130,(int)uStack_40);
        lStack_110 = CONCAT44(uStack_130._4_4_,uStack_40._4_4_);
        local_328 = local_108 + CONCAT44((undefined4)uStack_130,(int)uStack_40);
        lStack_320 = lStack_100 + CONCAT44(uStack_130._4_4_,uStack_40._4_4_);
        local_158 = uVar11;
        uStack_130 = uVar12;
      }
      local_2e0 = local_2e0 + 2;
      local_278 = uVar22;
      uStack_270 = uVar23;
      local_268 = uVar9;
      uStack_260 = uVar10;
      local_48 = uVar24;
      uStack_40 = uVar25;
    }
    local_a8 = local_348[0];
    uVar24 = local_a8;
    uStack_a0 = local_348[1];
    uVar26 = uStack_a0;
    local_b8 = local_348[2];
    uVar11 = local_b8;
    uStack_b0 = local_348[3];
    uVar12 = uStack_b0;
    local_a8._0_2_ = (short)local_348[0];
    local_a8._2_2_ = (short)(local_348[0] >> 0x10);
    local_a8._4_2_ = (short)(local_348[0] >> 0x20);
    local_a8._6_2_ = (short)(local_348[0] >> 0x30);
    uStack_a0._0_2_ = (short)local_348[1];
    uStack_a0._2_2_ = (short)(local_348[1] >> 0x10);
    uStack_a0._4_2_ = (short)(local_348[1] >> 0x20);
    uStack_a0._6_2_ = (short)(local_348[1] >> 0x30);
    local_b8._0_2_ = (short)local_348[2];
    local_b8._2_2_ = (short)(local_348[2] >> 0x10);
    local_b8._4_2_ = (short)(local_348[2] >> 0x20);
    local_b8._6_2_ = (short)(local_348[2] >> 0x30);
    uStack_b0._0_2_ = (short)local_348[3];
    uStack_b0._2_2_ = (short)(local_348[3] >> 0x10);
    uStack_b0._4_2_ = (short)(local_348[3] >> 0x20);
    uStack_b0._6_2_ = (short)(local_348[3] >> 0x30);
    cVar1 = (0 < (short)local_a8) * ((short)local_a8 < 0x100) * (char)local_348[0] -
            (0xff < (short)local_a8);
    cVar2 = (0 < local_a8._4_2_) * (local_a8._4_2_ < 0x100) * (char)(local_348[0] >> 0x20) -
            (0xff < local_a8._4_2_);
    cVar3 = (0 < (short)uStack_a0) * ((short)uStack_a0 < 0x100) * (char)local_348[1] -
            (0xff < (short)uStack_a0);
    cVar4 = (0 < uStack_a0._4_2_) * (uStack_a0._4_2_ < 0x100) * (char)(local_348[1] >> 0x20) -
            (0xff < uStack_a0._4_2_);
    cVar5 = (0 < (short)local_b8) * ((short)local_b8 < 0x100) * (char)local_348[2] -
            (0xff < (short)local_b8);
    cVar6 = (0 < local_b8._4_2_) * (local_b8._4_2_ < 0x100) * (char)(local_348[2] >> 0x20) -
            (0xff < local_b8._4_2_);
    cVar7 = (0 < (short)uStack_b0) * ((short)uStack_b0 < 0x100) * (char)local_348[3] -
            (0xff < (short)uStack_b0);
    cVar8 = (0 < uStack_b0._4_2_) * (uStack_b0._4_2_ < 0x100) * (char)(local_348[3] >> 0x20) -
            (0xff < uStack_b0._4_2_);
    sVar13 = CONCAT11((0 < local_a8._2_2_) * (local_a8._2_2_ < 0x100) * (char)(local_348[0] >> 0x10)
                      - (0xff < local_a8._2_2_),cVar1);
    uVar14 = CONCAT13((0 < local_a8._6_2_) * (local_a8._6_2_ < 0x100) * (char)(local_348[0] >> 0x30)
                      - (0xff < local_a8._6_2_),CONCAT12(cVar2,sVar13));
    uVar15 = CONCAT15((0 < uStack_a0._2_2_) * (uStack_a0._2_2_ < 0x100) *
                      (char)(local_348[1] >> 0x10) - (0xff < uStack_a0._2_2_),CONCAT14(cVar3,uVar14)
                     );
    uVar9 = CONCAT17((0 < uStack_a0._6_2_) * (uStack_a0._6_2_ < 0x100) *
                     (char)(local_348[1] >> 0x30) - (0xff < uStack_a0._6_2_),CONCAT16(cVar4,uVar15))
    ;
    sVar16 = CONCAT11((0 < local_b8._2_2_) * (local_b8._2_2_ < 0x100) * (char)(local_348[2] >> 0x10)
                      - (0xff < local_b8._2_2_),cVar5);
    uVar17 = CONCAT13((0 < local_b8._6_2_) * (local_b8._6_2_ < 0x100) * (char)(local_348[2] >> 0x30)
                      - (0xff < local_b8._6_2_),CONCAT12(cVar6,sVar16));
    uVar18 = CONCAT15((0 < uStack_b0._2_2_) * (uStack_b0._2_2_ < 0x100) *
                      (char)(local_348[3] >> 0x10) - (0xff < uStack_b0._2_2_),CONCAT14(cVar7,uVar17)
                     );
    uVar10 = CONCAT17((0 < uStack_b0._6_2_) * (uStack_b0._6_2_ < 0x100) *
                      (char)(local_348[3] >> 0x30) - (0xff < uStack_b0._6_2_),CONCAT16(cVar8,uVar18)
                     );
    local_c8 = uVar9;
    uVar9 = local_c8;
    uStack_c0 = uVar10;
    uVar10 = uStack_c0;
    local_d8 = local_318;
    uVar22 = local_d8;
    uStack_d0 = uStack_310;
    uVar23 = uStack_d0;
    local_c8._2_2_ = (short)((uint)uVar14 >> 0x10);
    local_c8._4_2_ = (short)((uint6)uVar15 >> 0x20);
    local_c8._6_2_ = (short)((ulong)uVar9 >> 0x30);
    uStack_c0._2_2_ = (short)((uint)uVar17 >> 0x10);
    uStack_c0._4_2_ = (short)((uint6)uVar18 >> 0x20);
    uStack_c0._6_2_ = (short)((ulong)uVar10 >> 0x30);
    local_d8._0_2_ = (short)local_318;
    local_d8._2_2_ = (short)((ulong)local_318 >> 0x10);
    local_d8._4_2_ = (short)((ulong)local_318 >> 0x20);
    local_d8._6_2_ = (short)((ulong)local_318 >> 0x30);
    uStack_d0._0_2_ = (short)uStack_310;
    uStack_d0._2_2_ = (short)((ulong)uStack_310 >> 0x10);
    uStack_d0._4_2_ = (short)((ulong)uStack_310 >> 0x20);
    uStack_d0._6_2_ = (short)((ulong)uStack_310 >> 0x30);
    local_98 = CONCAT17((0 < uStack_c0._6_2_) * (uStack_c0._6_2_ < 0x100) * cVar8 -
                        (0xff < uStack_c0._6_2_),
                        CONCAT16((0 < uStack_c0._4_2_) * (uStack_c0._4_2_ < 0x100) * cVar7 -
                                 (0xff < uStack_c0._4_2_),
                                 CONCAT15((0 < uStack_c0._2_2_) * (uStack_c0._2_2_ < 0x100) * cVar6
                                          - (0xff < uStack_c0._2_2_),
                                          CONCAT14((0 < sVar16) * (sVar16 < 0x100) * cVar5 -
                                                   (0xff < sVar16),
                                                   CONCAT13((0 < local_c8._6_2_) *
                                                            (local_c8._6_2_ < 0x100) * cVar4 -
                                                            (0xff < local_c8._6_2_),
                                                            CONCAT12((0 < local_c8._4_2_) *
                                                                     (local_c8._4_2_ < 0x100) *
                                                                     cVar3 - (0xff < local_c8._4_2_)
                                                                     ,CONCAT11((0 < local_c8._2_2_)
                                                                               * (local_c8._2_2_ <
                                                                                 0x100) * cVar2 -
                                                                               (0xff < local_c8.
                                                  _2_2_),(0 < sVar13) * (sVar13 < 0x100) * cVar1 -
                                                         (0xff < sVar13))))))));
    local_80 = local_2f0;
    uStack_90 = CONCAT17((0 < uStack_d0._6_2_) * (uStack_d0._6_2_ < 0x100) *
                         (char)((ulong)uStack_310 >> 0x30) - (0xff < uStack_d0._6_2_),
                         CONCAT16((0 < uStack_d0._4_2_) * (uStack_d0._4_2_ < 0x100) *
                                  (char)((ulong)uStack_310 >> 0x20) - (0xff < uStack_d0._4_2_),
                                  CONCAT15((0 < uStack_d0._2_2_) * (uStack_d0._2_2_ < 0x100) *
                                           (char)((ulong)uStack_310 >> 0x10) -
                                           (0xff < uStack_d0._2_2_),
                                           CONCAT14((0 < (short)uStack_d0) *
                                                    ((short)uStack_d0 < 0x100) * (char)uStack_310 -
                                                    (0xff < (short)uStack_d0),
                                                    CONCAT13((0 < local_d8._6_2_) *
                                                             (local_d8._6_2_ < 0x100) *
                                                             (char)((ulong)local_318 >> 0x30) -
                                                             (0xff < local_d8._6_2_),
                                                             CONCAT12((0 < local_d8._4_2_) *
                                                                      (local_d8._4_2_ < 0x100) *
                                                                      (char)((ulong)local_318 >>
                                                                            0x20) -
                                                                      (0xff < local_d8._4_2_),
                                                                      CONCAT11((0 < local_d8._2_2_)
                                                                               * (local_d8._2_2_ <
                                                                                 0x100) *
                                                                               (char)((ulong)
                                                  local_318 >> 0x10) - (0xff < local_d8._2_2_),
                                                  (0 < (short)local_d8) * ((short)local_d8 < 0x100)
                                                  * (char)local_318 - (0xff < (short)local_d8)))))))
                        );
    *local_2f0 = local_98;
    local_2f0 = local_2f0 + 1;
    local_d8 = uVar22;
    uStack_d0 = uVar23;
    local_c8 = uVar9;
    uStack_c0 = uVar10;
    local_b8 = uVar11;
    uStack_b0 = uVar12;
    local_a8 = uVar24;
    uStack_a0 = uVar26;
  }
  if (local_2f8 != (int64_t *)0x0) {
    a[1] = in_RSI;
    a[0] = (longlong)in_RDI;
    iVar33 = k_means_horizontal_sum_sse2(a);
    *local_2f8 = iVar33;
  }
  return;
}

Assistant:

void av1_calc_indices_dim2_sse2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m128i v_zero = _mm_setzero_si128();
  __m128i sum = _mm_setzero_si128();
  __m128i ind[2];
  __m128i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    const int16_t cx = centroids[2 * j], cy = centroids[2 * j + 1];
    cents[j] = _mm_set_epi16(cy, cx, cy, cx, cy, cx, cy, cx);
  }

  for (int i = 0; i < n; i += 8) {
    for (int l = 0; l < 2; ++l) {
      const __m128i in = _mm_loadu_si128((__m128i *)data);
      ind[l] = _mm_setzero_si128();
      // Compute the distance to the first centroid.
      __m128i d1 = _mm_sub_epi16(in, cents[0]);
      __m128i dist_min = _mm_madd_epi16(d1, d1);

      for (int j = 1; j < k; ++j) {
        // Compute the distance to the centroid.
        d1 = _mm_sub_epi16(in, cents[j]);
        const __m128i dist = _mm_madd_epi16(d1, d1);
        // Compare to the minimal one.
        const __m128i cmp = _mm_cmpgt_epi32(dist_min, dist);
        const __m128i dist1 = _mm_andnot_si128(cmp, dist_min);
        const __m128i dist2 = _mm_and_si128(cmp, dist);
        dist_min = _mm_or_si128(dist1, dist2);
        const __m128i ind1 = _mm_set1_epi32(j);
        ind[l] = _mm_or_si128(_mm_andnot_si128(cmp, ind[l]),
                              _mm_and_si128(cmp, ind1));
      }
      if (total_dist) {
        // Convert to 64 bit and add to sum.
        const __m128i dist1 = _mm_unpacklo_epi32(dist_min, v_zero);
        const __m128i dist2 = _mm_unpackhi_epi32(dist_min, v_zero);
        sum = _mm_add_epi64(sum, dist1);
        sum = _mm_add_epi64(sum, dist2);
      }
      data += 8;
    }
    // Cast to 8 bit and store.
    const __m128i d2 = _mm_packus_epi16(ind[0], ind[1]);
    const __m128i d3 = _mm_packus_epi16(d2, v_zero);
    _mm_storel_epi64((__m128i *)indices, d3);
    indices += 8;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_sse2(sum);
  }
}